

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulatorimpllinux.cpp
# Opt level: O0

void __thiscall
XInputSimulatorImplLinux::keySequence(XInputSimulatorImplLinux *this,string *sequence)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  reference pcVar7;
  undefined8 extraout_RDX;
  int keyCode;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *sequence_local;
  XInputSimulatorImplLinux *this_local;
  
  poVar6 = std::operator<<((ostream *)&std::cout,"key seq: ");
  poVar6 = std::operator<<(poVar6,(string *)sequence);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _keyCode = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&keyCode);
    if (!bVar2) break;
    pcVar7 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar7;
    poVar6 = std::operator<<((ostream *)&std::cout,"cahr: ");
    poVar6 = std::operator<<(poVar6,cVar1);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    uVar4 = (*(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl[0xc])
                      (this,(ulong)(uint)(int)cVar1,extraout_RDX,cVar1);
    poVar6 = std::operator<<((ostream *)&std::cout,"key code: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar4);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    iVar5 = isupper((int)cVar1);
    if (iVar5 == 0) {
      (*(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl[0xb])(this,(ulong)uVar4);
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,"upper ");
      poVar6 = std::operator<<(poVar6,cVar1);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      bVar3 = XKeysymToKeycode(this->display,0xffe1);
      (*(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl[9])(this,(ulong)bVar3);
      (*(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl[0xb])(this,(ulong)uVar4);
      bVar3 = XKeysymToKeycode(this->display,0xffe1);
      (*(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl[10])(this,(ulong)bVar3);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void XInputSimulatorImplLinux::keySequence(const std::string &sequence)
{
    std::cout << "key seq: " << sequence << std::endl;

    for(const char c : sequence) {
        std::cout << "cahr: " << c << std::endl;
        int keyCode = this->charToKeyCode(c);
        std::cout << "key code: " << keyCode << std::endl;

        if (isupper(c)) {
            std::cout << "upper " << c << std::endl;

            this->keyDown(XKeysymToKeycode(display, XK_Shift_L));
            this->keyClick(keyCode);
            this->keyUp(XKeysymToKeycode(display, XK_Shift_L));
        }
        else {
            this->keyClick(keyCode);
        }


        std::cout << std::endl;
    }

}